

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Cord::AppendImpl<absl::lts_20240722::Cord>(Cord *this,Cord *src)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  CordzInfo *pCVar4;
  size_t sVar5;
  undefined8 uVar6;
  byte bVar7;
  ulong uVar8;
  uint8_t *puVar9;
  CordRep *pCVar10;
  string_view src_00;
  string_view src_01;
  ChunkIterator __begin0;
  anon_union_16_2_39e9c77e_for_Rep_0 local_b8;
  undefined8 local_a8;
  size_t sStack_a0;
  CordRepBtreeReader local_98;
  
  bVar7 = (this->contents_).data_.rep_.field_0.data[0];
  pCVar10 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar10 != (CordRep *)0x0 && (bVar7 & 1) != 0) && (pCVar10->length == 0)) goto LAB_0011036f;
  while( true ) {
    bVar1 = (byte)((CordRepBtreeReader *)src)->remaining_;
    uVar2 = (ulong)(char)bVar1;
    if ((uVar2 & 1) == 0) {
      uVar8 = uVar2 >> 1;
    }
    else {
      uVar8 = **(ulong **)&((CordRepBtreeReader *)src)->navigator_;
    }
    if (uVar8 == 0) {
      return;
    }
    if ((bVar7 & 1) == 0) {
      uVar8 = (ulong)(long)(char)bVar7 >> 1;
    }
    else {
      uVar8 = pCVar10->length;
    }
    if (uVar8 == 0) {
      if ((bVar1 & 1) == 0) {
        pCVar10 = *(CordRep **)&((CordRepBtreeReader *)src)->navigator_;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info =
             ((CordRepBtreeReader *)src)->remaining_;
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar10;
      }
      else {
        uVar6 = *(undefined8 *)&((CordRepBtreeReader *)src)->navigator_;
        pCVar4 = cord_internal::InlineData::cordz_info((InlineData *)src);
        if (pCVar4 != (CordzInfo *)0x0) {
          absl::lts_20240722::cord_internal::CordzInfo::Untrack();
        }
        ((CordRepBtreeReader *)src)->remaining_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
        (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
        (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
        if ((CordRep *)uVar6 == (CordRep *)0x0) goto LAB_00110404;
        if (((CordRep *)uVar6)->tag == '\x02') {
          AppendImpl<absl::lts_20240722::Cord>();
          uVar6 = local_b8.as_tree.cordz_info;
        }
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)uVar6;
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
        plVar3 = (long *)__tls_get_addr(&PTR_0011cfd0);
        if (*plVar3 < 2) {
          AppendImpl<absl::lts_20240722::Cord>();
        }
        else {
          *plVar3 = *plVar3 + -1;
        }
      }
      return;
    }
    if ((uVar2 & 1) == 0) break;
    uVar6 = *(undefined8 *)&((CordRepBtreeReader *)src)->navigator_;
    uVar2 = ((Nonnull<cord_internal::CordRep_*>)uVar6)->length;
    if (0x1ff < uVar2) {
      pCVar4 = cord_internal::InlineData::cordz_info((InlineData *)src);
      if (pCVar4 != (CordzInfo *)0x0) {
        absl::lts_20240722::cord_internal::CordzInfo::Untrack();
      }
      ((CordRepBtreeReader *)src)->remaining_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
      (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
      (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
      if (((Nonnull<cord_internal::CordRep_*>)uVar6)->tag == '\x02') {
        AppendImpl<absl::lts_20240722::Cord>();
        uVar6 = local_b8.as_tree.cordz_info;
      }
      InlineRep::AppendTree(&this->contents_,(Nonnull<CordRep_*>)uVar6,kAppendCord);
      return;
    }
    if (5 < ((Nonnull<cord_internal::CordRep_*>)uVar6)->tag) {
      if (0xf8 < ((Nonnull<cord_internal::CordRep_*>)uVar6)->tag) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
      }
      puVar9 = ((Nonnull<cord_internal::CordRep_*>)uVar6)->storage;
      goto LAB_0011016b;
    }
    if (src == this) {
      Cord((Cord *)&local_b8.as_tree,src);
      AppendImpl<absl::lts_20240722::Cord>(this,(Cord *)&local_b8.as_tree);
      ~Cord((Cord *)&local_b8.as_tree);
      return;
    }
    local_a8 = 0;
    local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
    local_98.remaining_ = 0;
    local_98.navigator_.height_ = -1;
    sStack_a0 = ((Nonnull<cord_internal::CordRep_*>)uVar6)->length;
    if (sStack_a0 == 0) {
      return;
    }
    ChunkIterator::InitTree
              ((ChunkIterator *)&local_b8.as_tree,(Nonnull<cord_internal::CordRep_*>)uVar6);
    if (sStack_a0 == 0) {
      return;
    }
    src = (Cord *)&local_98;
    uVar6 = local_b8.as_tree.cordz_info;
    while( true ) {
      src_01._M_str = (char *)local_b8.as_tree.rep;
      src_01._M_len = uVar6;
      InlineRep::AppendArray(&this->contents_,src_01,kAppendString);
      if (sStack_a0 == 0) break;
      sVar5 = sStack_a0 - local_b8._0_8_;
      if (sStack_a0 < (ulong)local_b8.as_tree.cordz_info) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      uVar6 = sStack_a0;
      sStack_a0 = sVar5;
      if (sVar5 != 0) {
        if (((long)local_98.navigator_.height_ < 0) ||
           (local_98.navigator_.node_[local_98.navigator_.height_] == (CordRepBtree *)0x0)) {
          if (local_b8.as_tree.cordz_info == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8 = (anon_union_16_2_39e9c77e_for_Rep_0)ZEXT816(0);
          uVar6 = 0;
        }
        else {
          local_b8.as_tree =
               (AsTree)cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)src);
          uVar6 = local_b8.as_tree.cordz_info;
        }
      }
      if (sStack_a0 == 0) {
        return;
      }
    }
    AppendImpl<absl::lts_20240722::Cord>();
LAB_0011036f:
    AppendImpl<absl::lts_20240722::Cord>();
    pCVar10 = (CordRep *)0x0;
    bVar7 = 0;
  }
  if ((char)bVar1 < '\0') {
    ((CordRepBtreeReader *)src)->remaining_ = 0;
    (((CordRepBtreeReader *)src)->navigator_).height_ = 0;
    (((CordRepBtreeReader *)src)->navigator_).index_[0] = '\0';
    (((CordRepBtreeReader *)src)->navigator_).index_[1] = '\0';
    (((CordRepBtreeReader *)src)->navigator_).index_[2] = '\0';
    (((CordRepBtreeReader *)src)->navigator_).index_[3] = '\0';
LAB_00110404:
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                  ,0x37,"CordRep *absl::cord_internal::RemoveCrcNode(CordRep *)");
  }
  uVar2 = (ulong)(bVar1 >> 1);
  puVar9 = (uint8_t *)0x0;
  if ((bVar1 & 1) == 0) {
    puVar9 = (uint8_t *)((long)&((CordRepBtreeReader *)src)->remaining_ + 1);
  }
LAB_0011016b:
  src_00._M_str = (char *)puVar9;
  src_00._M_len = uVar2;
  InlineRep::AppendArray(&this->contents_,src_00,kAppendCord);
  return;
}

Assistant:

inline void Cord::AppendImpl(C&& src) {
  auto constexpr method = CordzUpdateTracker::kAppendCord;

  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;

  if (empty()) {
    // Since destination is empty, we can avoid allocating a node,
    if (src.contents_.is_tree()) {
      // by taking the tree directly
      CordRep* rep =
          cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
      contents_.EmplaceTree(rep, method);
    } else {
      // or copying over inline data
      contents_.data_ = src.contents_.data_;
    }
    return;
  }

  // For short cords, it is faster to copy data if there is room in dst.
  const size_t src_size = src.contents_.size();
  if (src_size <= kMaxBytesToCopy) {
    CordRep* src_tree = src.contents_.tree();
    if (src_tree == nullptr) {
      // src has embedded data.
      contents_.AppendArray({src.contents_.data(), src_size}, method);
      return;
    }
    if (src_tree->IsFlat()) {
      // src tree just has one flat node.
      contents_.AppendArray({src_tree->flat()->Data(), src_size}, method);
      return;
    }
    if (&src == this) {
      // ChunkIterator below assumes that src is not modified during traversal.
      Append(Cord(src));
      return;
    }
    // TODO(mec): Should we only do this if "dst" has space?
    for (absl::string_view chunk : src.Chunks()) {
      Append(chunk);
    }
    return;
  }

  // Guaranteed to be a tree (kMaxBytesToCopy > kInlinedSize)
  CordRep* rep = cord_internal::RemoveCrcNode(std::forward<C>(src).TakeRep());
  contents_.AppendTree(rep, CordzUpdateTracker::kAppendCord);
}